

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integer_cast_operator.hpp
# Opt level: O3

bool duckdb::
     IntegerCastLoop<duckdb::IntegerCastData<short>,false,false,duckdb::IntegerCastOperation,(char)46>
               (char *buf,idx_t len,IntegerCastData<short> *result,bool strict)

{
  byte bVar1;
  byte bVar2;
  ulong uVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  
  if (*buf == '+' && strict) {
    return false;
  }
  uVar6 = (ulong)(*buf == '+');
  uVar4 = uVar6;
  if (uVar6 < len) {
    uVar5 = (uint)(ushort)result->result;
    uVar3 = uVar6;
    do {
      bVar1 = buf[uVar3];
      bVar2 = bVar1 - 0x30;
      if (9 < bVar2) {
        uVar4 = uVar3;
        if (bVar1 == 0x2e) {
          if (strict) {
            return false;
          }
          uVar4 = uVar3 + 1;
          if (len <= uVar4) {
            if (uVar3 <= uVar6) {
              return false;
            }
            break;
          }
          bVar1 = buf[uVar3 + 1];
          if ((byte)(bVar1 - 0x30) < 10 || uVar3 <= uVar6) {
            return false;
          }
        }
        if (0x20 < bVar1) {
          return false;
        }
        if ((0x100003e00U >> ((ulong)bVar1 & 0x3f) & 1) == 0) {
          return false;
        }
        uVar3 = uVar4 + 1;
        uVar4 = uVar3;
        if (uVar3 < len) {
          do {
            if ((0x20 < (ulong)(byte)buf[uVar3]) ||
               ((0x100003e00U >> ((ulong)(byte)buf[uVar3] & 0x3f) & 1) == 0)) {
              return false;
            }
            uVar3 = uVar3 + 1;
            uVar4 = len;
          } while (len != uVar3);
        }
        break;
      }
      if ((short)((bVar2 ^ 0x7ffe) / 10) < (short)uVar5) {
        return false;
      }
      uVar7 = uVar3 + 1;
      uVar5 = (uint)bVar2 + uVar5 * 10;
      result->result = (ResultType_conflict)uVar5;
      uVar4 = len;
      if (uVar7 == len) break;
      if (buf[uVar7] == '_' && !strict) {
        uVar7 = uVar3 + 2;
        if (uVar7 == len) {
          return false;
        }
        if (9 < (byte)(buf[uVar7] - 0x30U)) {
          return false;
        }
      }
      uVar4 = uVar7;
      uVar3 = uVar7;
    } while (uVar7 < len);
  }
  return uVar6 < uVar4;
}

Assistant:

static bool IntegerCastLoop(const char *buf, idx_t len, T &result, bool strict) {
	idx_t start_pos;
	if (NEGATIVE) {
		start_pos = 1;
	} else {
		if (*buf == '+') {
			if (strict) {
				// leading plus is not allowed in strict mode
				return false;
			}
			start_pos = 1;
		} else {
			start_pos = 0;
		}
	}
	idx_t pos = start_pos;
	while (pos < len) {
		if (!StringUtil::CharacterIsDigit(buf[pos])) {
			// not a digit!
			if (buf[pos] == decimal_separator) {
				if (strict) {
					return false;
				}
				bool number_before_period = pos > start_pos;
				// decimal point: we accept decimal values for integers as well
				// we just truncate them
				// make sure everything after the period is a number
				pos++;
				idx_t start_digit = pos;
				while (pos < len) {
					if (!StringUtil::CharacterIsDigit(buf[pos])) {
						break;
					}
					if (!OP::template HandleDecimal<T, NEGATIVE, ALLOW_EXPONENT>(
					        result, UnsafeNumericCast<uint8_t>(buf[pos] - '0'))) {
						return false;
					}
					pos++;

					if (pos != len && buf[pos] == '_') {
						// Skip one underscore if it is not the last character and followed by a digit
						pos++;
						if (pos == len || !StringUtil::CharacterIsDigit(buf[pos])) {
							return false;
						}
					}
				}
				// make sure there is either (1) one number after the period, or (2) one number before the period
				// i.e. we accept "1." and ".1" as valid numbers, but not "."
				if (!(number_before_period || pos > start_digit)) {
					return false;
				}
				if (pos >= len) {
					break;
				}
			}
			if (StringUtil::CharacterIsSpace(buf[pos])) {
				// skip any trailing spaces
				while (++pos < len) {
					if (!StringUtil::CharacterIsSpace(buf[pos])) {
						return false;
					}
				}
				break;
			}
			if (ALLOW_EXPONENT) {
				if (buf[pos] == 'e' || buf[pos] == 'E') {
					if (strict) {
						return false;
					}
					if (pos == start_pos) {
						return false;
					}
					pos++;
					if (pos >= len) {
						return false;
					}
					using ExponentData = IntegerCastData<int16_t>;
					ExponentData exponent {};
					int negative = buf[pos] == '-';
					if (negative) {
						if (!IntegerCastLoop<ExponentData, true, false, IntegerCastOperation, decimal_separator>(
						        buf + pos, len - pos, exponent, strict)) {
							return false;
						}
					} else {
						if (!IntegerCastLoop<ExponentData, false, false, IntegerCastOperation, decimal_separator>(
						        buf + pos, len - pos, exponent, strict)) {
							return false;
						}
					}
					return OP::template HandleExponent<T, NEGATIVE>(result, exponent.result);
				}
			}
			return false;
		}
		auto digit = UnsafeNumericCast<uint8_t>(buf[pos++] - '0');
		if (!OP::template HandleDigit<T, NEGATIVE>(result, digit)) {
			return false;
		}

		if (pos != len && buf[pos] == '_' && !strict) {
			// Skip one underscore if it is not the last character and followed by a digit
			pos++;
			if (pos == len || !StringUtil::CharacterIsDigit(buf[pos])) {
				return false;
			}
		}
	}
	if (!OP::template Finalize<T, NEGATIVE>(result)) {
		return false;
	}
	return pos > start_pos;
}